

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O2

void wasm::TypeUpdating::updateParamTypes
               (Function *func,vector<wasm::Type,_std::allocator<wasm::Type>_> *newParamTypes,
               Module *wasm,LocalUpdatingMode localUpdating)

{
  Expression **__x;
  LocalSet *pLVar1;
  pointer ppLVar2;
  bool bVar3;
  Index IVar4;
  size_type sVar5;
  Type TVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  iterator iVar9;
  LocalGet *pLVar10;
  Block *pBVar11;
  uint uVar12;
  undefined1 auVar13 [8];
  pointer ppLVar14;
  pointer ppLVar15;
  undefined1 auStack_208 [8];
  Index index;
  _Alloc_hider local_1f8;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> local_1d8;
  undefined1 local_c8 [8];
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  paramFixups;
  undefined1 local_88 [8];
  FindAll<wasm::LocalGet> gets;
  FindAll<wasm::LocalSet> sets;
  Builder builder;
  uint local_34;
  
  local_c8 = (undefined1  [8])&paramFixups._M_h._M_rehash_policy._M_next_resize;
  paramFixups._M_h._M_buckets = (__buckets_ptr)0x1;
  paramFixups._M_h._M_bucket_count = 0;
  paramFixups._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  paramFixups._M_h._M_element_count._0_4_ = 0x3f800000;
  paramFixups._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  paramFixups._M_h._M_rehash_policy._4_4_ = 0;
  paramFixups._M_h._M_rehash_policy._M_next_resize = 0;
  FindAll<wasm::LocalSet>::FindAll
            ((FindAll<wasm::LocalSet> *)
             &gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,func->body);
  ppLVar15 = sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  __x = &func->body;
  for (ppLVar14 = (pointer)gets.list.
                           super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage; ppLVar14 != ppLVar15;
      ppLVar14 = ppLVar14 + 1) {
    pLVar1 = *ppLVar14;
    IVar4 = pLVar1->index;
    auStack_208._0_4_ = IVar4;
    bVar3 = Function::isParam(func,IVar4);
    if (((bVar3) &&
        (sVar5 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)local_c8,(key_type *)auStack_208), sVar5 == 0)) &&
       (bVar3 = wasm::Type::isSubType
                          ((Type)(pLVar1->value->type).id,
                           (Type)(newParamTypes->
                                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(ulong)auStack_208 & 0xffffffff].id), !bVar3)) {
      TVar6 = Function::getLocalType(func,auStack_208._0_4_);
      IVar4 = Builder::addVar(func,TVar6);
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_c8,(key_type *)auStack_208);
      *pmVar7 = IVar4;
    }
  }
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)local_88,*__x);
  if (paramFixups._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    auStack_208 = (undefined1  [8])0x0;
    _index = (PassRunner *)0x0;
    local_1f8._M_p = (pointer)0x0;
    uVar12 = 0;
    sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)wasm;
    while (local_34 = uVar12, sVar8 = Function::getNumParams(func), uVar12 < sVar8) {
      iVar9 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)local_c8,&local_34);
      uVar12 = local_34;
      if (iVar9.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          != (__node_type *)0x0) {
        IVar4 = *(Index *)((long)iVar9.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                 ._M_cur + 0xc);
        if (localUpdating == Update) {
          TVar6.id = (newParamTypes->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
                     _M_impl.super__Vector_impl_data._M_start[local_34].id;
        }
        else {
          TVar6 = Function::getLocalType(func,local_34);
        }
        pLVar10 = MixedArena::alloc<wasm::LocalGet>
                            ((MixedArena *)
                             (sets.list.
                              super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x2b));
        pLVar10->index = uVar12;
        (pLVar10->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             TVar6.id;
        paramFixups._M_h._M_single_bucket =
             (__node_base_ptr)
             Builder::makeLocalSet
                       ((Builder *)
                        &sets.list.
                         super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,IVar4,
                        (Expression *)pLVar10);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_208,
                   (Expression **)&paramFixups._M_h._M_single_bucket);
      }
      uVar12 = local_34 + 1;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_208,__x);
    pBVar11 = Builder::
              makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                        ((Builder *)
                         &sets.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         auStack_208);
    ppLVar2 = gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    *__x = (Expression *)pBVar11;
    for (auVar13 = local_88;
        ppLVar15 = sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                   ._M_impl.super__Vector_impl_data._M_start, auVar13 != (undefined1  [8])ppLVar2;
        auVar13 = (undefined1  [8])((long)auVar13 + 8)) {
      pLVar10 = *(LocalGet **)auVar13;
      iVar9 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)local_c8,&pLVar10->index);
      if (iVar9.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          != (__node_type *)0x0) {
        pLVar10->index =
             *(Index *)((long)iVar9.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              ._M_cur + 0xc);
      }
    }
    for (ppLVar14 = (pointer)gets.list.
                             super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppLVar14 != ppLVar15; ppLVar14 = ppLVar14 + 1) {
      pLVar1 = *ppLVar14;
      iVar9 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)local_c8,&pLVar1->index);
      if (iVar9.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          != (__node_type *)0x0) {
        pLVar1->index =
             *(Index *)((long)iVar9.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              ._M_cur + 0xc);
      }
    }
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_208)
    ;
  }
  auVar13 = local_88;
  if (localUpdating == Update) {
    for (; ppLVar15 = (pointer)gets.list.
                               super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
        auVar13 !=
        (undefined1  [8])
        gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
        super__Vector_impl_data._M_start; auVar13 = (undefined1  [8])((long)auVar13 + 8)) {
      pLVar10 = *(LocalGet **)auVar13;
      uVar12 = pLVar10->index;
      bVar3 = Function::isParam(func,uVar12);
      if (bVar3) {
        (pLVar10->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             (newParamTypes->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar12].id;
      }
    }
    for (; ppLVar15 !=
           sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
           .super__Vector_impl_data._M_start; ppLVar15 = ppLVar15 + 1) {
      pLVar1 = *ppLVar15;
      uVar12 = pLVar1->index;
      bVar3 = Function::isParam(func,uVar12);
      if ((bVar3) && (bVar3 = LocalSet::isTee(pLVar1), bVar3)) {
        (pLVar1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id =
             (newParamTypes->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar12].id;
        LocalSet::finalize(pLVar1);
      }
    }
  }
  ReFinalize::ReFinalize((ReFinalize *)auStack_208);
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
            (&local_1d8,func,wasm);
  ReFinalize::~ReFinalize((ReFinalize *)auStack_208);
  if (paramFixups._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    handleNonDefaultableLocals(func,wasm);
  }
  std::_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::~_Vector_base
            ((_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)local_88);
  std::_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::~_Vector_base
            ((_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
             &gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_c8);
  return;
}

Assistant:

void updateParamTypes(Function* func,
                      const std::vector<Type>& newParamTypes,
                      Module& wasm,
                      LocalUpdatingMode localUpdating) {
  // Before making this update, we must be careful if the param was "reused",
  // specifically, if it is assigned a less-specific type in the body then
  // we'd get a validation error when we refine it. To handle that, if a less-
  // specific type is assigned simply switch to a new local, that is, we can
  // do a fixup like this:
  //
  // function foo(x : oldType) {
  //   ..
  //   x = (oldType)val;
  //
  // =>
  //
  // function foo(x : newType) {
  //   var x_oldType = x; // assign the param immediately to a fixup var
  //   ..
  //   x_oldType = (oldType)val; // fixup var is used throughout the body
  //
  // Later optimization passes may be able to remove the extra var, and can
  // take advantage of the refined argument type while doing so.

  // A map of params that need a fixup to the new fixup var used for it.
  std::unordered_map<Index, Index> paramFixups;

  FindAll<LocalSet> sets(func->body);

  for (auto* set : sets.list) {
    auto index = set->index;
    if (func->isParam(index) && !paramFixups.count(index) &&
        !Type::isSubType(set->value->type, newParamTypes[index])) {
      paramFixups[index] = Builder::addVar(func, func->getLocalType(index));
    }
  }

  FindAll<LocalGet> gets(func->body);

  // Apply the fixups we identified that we need.
  if (!paramFixups.empty()) {
    // Write the params immediately to the fixups.
    Builder builder(wasm);
    std::vector<Expression*> contents;
    for (Index index = 0; index < func->getNumParams(); index++) {
      auto iter = paramFixups.find(index);
      if (iter != paramFixups.end()) {
        auto fixup = iter->second;
        contents.push_back(builder.makeLocalSet(
          fixup,
          builder.makeLocalGet(index,
                               localUpdating == Update
                                 ? newParamTypes[index]
                                 : func->getLocalType(index))));
      }
    }
    contents.push_back(func->body);
    func->body = builder.makeBlock(contents);

    // Update gets and sets using the param to use the fixup.
    for (auto* get : gets.list) {
      auto iter = paramFixups.find(get->index);
      if (iter != paramFixups.end()) {
        get->index = iter->second;
      }
    }
    for (auto* set : sets.list) {
      auto iter = paramFixups.find(set->index);
      if (iter != paramFixups.end()) {
        set->index = iter->second;
      }
    }
  }

  // Update local.get/local.tee operations that use the modified param type.
  if (localUpdating == Update) {
    for (auto* get : gets.list) {
      auto index = get->index;
      if (func->isParam(index)) {
        get->type = newParamTypes[index];
      }
    }
    for (auto* set : sets.list) {
      auto index = set->index;
      if (func->isParam(index) && set->isTee()) {
        set->type = newParamTypes[index];
        set->finalize();
      }
    }
  }

  // Propagate the new get and set types outwards.
  ReFinalize().walkFunctionInModule(func, &wasm);

  if (!paramFixups.empty()) {
    // We have added locals, and must handle non-nullability of them.
    TypeUpdating::handleNonDefaultableLocals(func, wasm);
  }
}